

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O1

REF_STATUS ref_matrix_show_eig(REF_INT n,REF_DBL *a,REF_DBL *values,REF_DBL *vectors)

{
  ulong uVar1;
  REF_DBL *pRVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (ulong)(uint)n;
  if (0 < n && a != (REF_DBL *)0x0) {
    uVar4 = 0;
    uVar1 = uVar3;
    pRVar2 = a;
    do {
      do {
        putchar(0x20);
        printf("%15.7e",*a);
        a = a + uVar3;
        uVar1 = uVar1 - 1;
      } while (uVar1 != 0);
      putchar(10);
      uVar4 = uVar4 + 1;
      a = pRVar2 + 1;
      uVar1 = uVar3;
      pRVar2 = a;
    } while (uVar4 != uVar3);
  }
  if (0 < n) {
    uVar1 = 0;
    do {
      printf("%23.15e",values[uVar1]);
      printf(" |");
      uVar4 = 0;
      pRVar2 = vectors;
      do {
        printf("%15.7e",*pRVar2);
        if ((long)uVar4 < (long)(n + -1)) {
          putchar(0x20);
        }
        uVar4 = uVar4 + 1;
        pRVar2 = pRVar2 + uVar3;
      } while (uVar3 != uVar4);
      putchar(10);
      uVar1 = uVar1 + 1;
      vectors = vectors + 1;
    } while (uVar1 != uVar3);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_show_eig(REF_INT n, REF_DBL *a, REF_DBL *values,
                                       REF_DBL *vectors) {
  REF_INT row, col;

  if (NULL != a) {
    for (row = 0; row < n; row++) {
      for (col = 0; col < n; col++) {
        printf(" ");
        printf("%15.7e", a[row + n * col]);
      }
      printf("\n");
    }
  }
  for (row = 0; row < n; row++) {
    printf("%23.15e", values[row]);
    printf(" |");
    for (col = 0; col < n; col++) {
      printf("%15.7e", vectors[row + n * col]);
      if (col < n - 1) printf(" ");
    }
    printf("\n");
  }

  return REF_SUCCESS;
}